

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphic.cpp
# Opt level: O2

void __thiscall graphic::dispatch_updates(graphic *this)

{
  long lVar1;
  ostream *poVar2;
  hint *phVar3;
  ulong uVar4;
  span<mpt::updates<const_mpt::convertable_*,_mpt::graphic::hint>::element> sVar5;
  
  sVar5 = mpt::updates<const_mpt::convertable_*,_mpt::graphic::hint>::elements
                    ((updates<const_mpt::convertable_*,_mpt::graphic::hint> *)(this + 0x10));
  phVar3 = &(sVar5._base)->hint;
  uVar4 = sVar5._len & 0xfffffffffffffff0;
  do {
    if (uVar4 == 0) {
      return;
    }
    if (*(long *)(phVar3 + -8) == 0) {
LAB_00103407:
      poVar2 = (ostream *)operator<<((ostream *)&std::cout,phVar3);
      poVar2 = std::operator<<(poVar2,": ");
      poVar2 = std::ostream::_M_insert<void_const*>(poVar2);
    }
    else {
      lVar1 = __dynamic_cast(*(long *)(phVar3 + -8),&mpt::convertable::typeinfo,
                             &mpt::layout::typeinfo,0);
      if ((lVar1 == 0) || (*(long *)(lVar1 + 0x30) == 0)) goto LAB_00103407;
      poVar2 = (ostream *)operator<<((ostream *)&std::cout,phVar3);
      poVar2 = std::operator<<(poVar2,": ");
      poVar2 = std::operator<<(poVar2,*(char **)(lVar1 + 0x30));
      poVar2 = std::operator<<(poVar2,'(');
      poVar2 = std::ostream::_M_insert<void_const*>(poVar2);
      poVar2 = std::operator<<(poVar2,')');
    }
    std::endl<char,std::char_traits<char>>(poVar2);
    *(undefined4 *)(phVar3 + 4) = 0;
    phVar3 = phVar3 + 0x10;
    uVar4 = uVar4 - 0x10;
  } while( true );
}

Assistant:

void graphic::dispatch_updates()
{
	for (auto &e : elements()) {
		const mpt::layout *l = dynamic_cast<const mpt::layout *>(e.data);
		const char *name;
		if (l && (name = l->alias())) {
			std::cout << e.hint << ": " << l->alias() << '(' << e.data << ')' << std::endl;
		} else {
			std::cout << e.hint << ": " << e.data << std::endl;
		}
		e.invalidate();
	}
}